

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O1

nodemetalookuphead * BuildLookup(nodecontext *p,array *List)

{
  nodemetalookuphead *pnVar1;
  nodemetalookuphead Head;
  long local_20;
  
  if (List != (array *)0x0) {
    local_20 = (List->_Used >> 4) - 1;
    pnVar1 = (nodemetalookuphead *)(*p->NodeConstHeap->Alloc)(p->NodeConstHeap,List->_Used + 8);
    if (pnVar1 != (nodemetalookuphead *)0x0) {
      (*p->NodeConstHeap->Write)(p->NodeConstHeap,pnVar1,&local_20,0,8);
      (*p->NodeConstHeap->Write)(p->NodeConstHeap,pnVar1,List->_Begin,8,List->_Used);
    }
    ArrayClear(List);
    return pnVar1;
  }
  __assert_fail("&(*List)!=NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                ,0x423,"nodemetalookuphead *BuildLookup(nodecontext *, array *)");
}

Assistant:

static NOINLINE nodemetalookuphead* BuildLookup(nodecontext* p,array* List)
{
    nodemetalookuphead* v;
    nodemetalookuphead Head;
    Head.Upper = ARRAYCOUNT(*List,nodemetalookup)-1;
    v = MemHeap_Alloc(p->NodeConstHeap,sizeof(Head)+ARRAYCOUNT(*List,uint8_t));
    if (v)
    {
        MemHeap_Write(p->NodeConstHeap,v,&Head,0,sizeof(Head));
        MemHeap_Write(p->NodeConstHeap,v,ARRAYBEGIN(*List,nodemetalookup),sizeof(Head),ARRAYCOUNT(*List,uint8_t));
    }
    ArrayClear(List);
    return v;
}